

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCof.c
# Opt level: O0

int Cof_ObjMffcSize(Cof_Obj_t *pNode)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int nFanout;
  int Count2;
  int Count1;
  Cof_Obj_t *pNode_local;
  
  uVar1 = *(uint *)pNode;
  *(uint *)pNode = *(uint *)pNode & 0xff | 0x100;
  iVar2 = Cof_NodeDeref_rec(pNode);
  iVar3 = Cof_NodeRef_rec(pNode);
  *(uint *)pNode = *(uint *)pNode & 0xff | uVar1 & 0xffffff00;
  if (iVar2 == iVar3) {
    return iVar2;
  }
  __assert_fail("Count1 == Count2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCof.c"
                ,0x24e,"int Cof_ObjMffcSize(Cof_Obj_t *)");
}

Assistant:

static inline int Cof_ObjMffcSize( Cof_Obj_t * pNode )
{
    int Count1, Count2, nFanout;
    nFanout = pNode->nFanouts;
    pNode->nFanouts = 1;
    Count1 = Cof_NodeDeref_rec( pNode );
    Count2 = Cof_NodeRef_rec( pNode );
    pNode->nFanouts = nFanout;
    assert( Count1 == Count2 );
    return Count1;
}